

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *this_00;
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_01;
  iterator iVar1;
  pointer paVar2;
  iterator __position;
  pointer paVar3;
  pointer paVar4;
  pointer paVar5;
  iterator __position_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<unsigned_int,_float> pVar11;
  aiVertexWeight aVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  Logger *pLVar17;
  pointer pMVar18;
  aiMesh *paVar19;
  ulong uVar20;
  ulong *puVar21;
  aiFace *paVar22;
  aiVector3D *paVar23;
  uint *puVar24;
  aiColor4D *paVar25;
  aiBone **ppaVar26;
  aiBone *paVar27;
  aiVertexWeight *paVar28;
  ulong *puVar29;
  void *pvVar30;
  pointer pBVar31;
  pointer pBVar32;
  pointer pFVar33;
  aiFace *paVar34;
  uint uVar35;
  ulong uVar36;
  pointer pBVar37;
  uint c;
  int iVar38;
  iterator __position_01;
  ulong uVar39;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_02;
  long lVar40;
  uint uVar41;
  Parser *pPVar42;
  pointer *ppaVar43;
  pointer ppVar44;
  long lVar45;
  pointer pMVar46;
  pointer pBVar47;
  aiMesh *p_pcOut;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  undefined8 local_b0;
  aiMesh *local_a8;
  ulong *local_a0;
  aiBone **local_98;
  pair<unsigned_int,_float> local_90;
  pointer local_88;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_80;
  ulong *local_68;
  pointer local_60;
  ulong local_58;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_50;
  ASEImporter *local_48;
  ulong *local_40;
  size_t local_38;
  
  uVar20 = (ulong)mesh->iMaterialIndex;
  pPVar42 = this->mParser;
  pMVar18 = (pPVar42->m_vMaterials).
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar36 = ((long)(pPVar42->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pMVar18 >> 5) *
           -0x2c8590b21642c859;
  local_50 = (vector<aiMesh*,std::allocator<aiMesh*>> *)avOutMeshes;
  local_48 = this;
  if (uVar36 < uVar20 || uVar36 - uVar20 == 0) {
    mesh->iMaterialIndex = (int)uVar36 - 1;
    pLVar17 = DefaultLogger::get();
    Logger::warn(pLVar17,"Material index is out of range");
    pPVar42 = local_48->mParser;
    uVar20 = (ulong)mesh->iMaterialIndex;
    pMVar18 = (pPVar42->m_vMaterials).
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (*(pointer *)
       &pMVar18[uVar20].avSubMaterials.
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl ==
      *(pointer *)
       ((long)&pMVar18[uVar20].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl + 8)) {
    paVar19 = (aiMesh *)operator_new(0x520);
    paVar19->mNumVertices = 0;
    paVar19->mNumFaces = 0;
    memset(&paVar19->mVertices,0,0xcc);
    paVar19->mBones = (aiBone **)0x0;
    paVar19->mMaterialIndex = 0;
    (paVar19->mName).length = 0;
    (paVar19->mName).data[0] = '\0';
    memset((paVar19->mName).data + 1,0x1b,0x3ff);
    paVar19->mNumAnimMeshes = 0;
    paVar19->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar19->mMethod = 0;
    (paVar19->mAABB).mMin.x = 0.0;
    (paVar19->mAABB).mMin.y = 0.0;
    (paVar19->mAABB).mMin.z = 0.0;
    (paVar19->mAABB).mMax.x = 0.0;
    (paVar19->mAABB).mMax.y = 0.0;
    (paVar19->mAABB).mMax.z = 0.0;
    memset(paVar19->mColors,0,0xa0);
    paVar19->mPrimitiveTypes = 4;
    paVar19->mMaterialIndex = 0xffffffff;
    (pPVar42->m_vMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start[uVar20].bNeed = true;
    paVar19->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    paVar19->mColors[2] = (aiColor4D *)mesh;
    iVar1._M_current = *(aiMesh ***)(local_50 + 8);
    local_b0 = paVar19;
    if (iVar1._M_current == *(aiMesh ***)(local_50 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (local_50,iVar1,(aiMesh **)&local_b0);
    }
    else {
      *iVar1._M_current = paVar19;
      *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
    }
    paVar19 = local_b0;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar2 != paVar3) {
        local_b0->mNumVertices = (int)((ulong)((long)paVar3 - (long)paVar2) >> 2) * -0x55555555;
        uVar16 = (int)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x3e0f83e1;
        local_b0->mNumFaces = uVar16;
        uVar20 = (ulong)uVar16;
        puVar29 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar29 = uVar20;
        paVar22 = (aiFace *)(puVar29 + 1);
        if (uVar20 != 0) {
          paVar34 = paVar22;
          do {
            paVar34->mNumIndices = 0;
            paVar34->mIndices = (uint *)0x0;
            paVar34 = paVar34 + 1;
          } while (paVar34 != paVar22 + uVar20);
        }
        local_a8 = paVar19;
        paVar19->mFaces = paVar22;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = ((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555;
        uVar20 = SUB168(auVar8 * ZEXT816(0xc),0);
        if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
          uVar20 = 0xffffffffffffffff;
        }
        paVar23 = (aiVector3D *)operator_new__(uVar20);
        lVar45 = (long)paVar3 - (long)paVar2;
        if (lVar45 != 0) {
          memset(paVar23,0,((lVar45 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar19 = local_a8;
        local_a8->mVertices = paVar23;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar23,paVar2,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2);
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = ((long)paVar3 - (long)paVar2 >> 2) * -0x5555555555555555;
        uVar20 = 0xffffffffffffffff;
        if (SUB168(auVar9 * ZEXT816(0xc),8) == 0) {
          uVar20 = SUB168(auVar9 * ZEXT816(0xc),0);
        }
        paVar23 = (aiVector3D *)operator_new__(uVar20);
        lVar45 = (long)paVar3 - (long)paVar2;
        if (lVar45 != 0) {
          memset(paVar23,0,((lVar45 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar19->mNormals = paVar23;
        paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar23,paVar2,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2);
        ppaVar43 = &mesh->amTexCoords[0].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar45 = 0;
        do {
          if (((_Vector_impl_data *)(ppaVar43 + -1))->_M_start != *ppaVar43) {
            lVar40 = (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = (lVar40 >> 2) * -0x5555555555555555;
            uVar20 = SUB168(auVar10 * ZEXT816(0xc),0);
            if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
              uVar20 = 0xffffffffffffffff;
            }
            pvVar30 = operator_new__(uVar20);
            memset(pvVar30,0,((lVar40 - 0xcU) / 0xc) * 0xc + 0xc);
            *(void **)((long)local_b0->mTextureCoords + lVar45 * 2) = pvVar30;
            memcpy(*(void **)((long)local_b0->mTextureCoords + lVar45 * 2),
                   ((_Vector_impl_data *)(ppaVar43 + -1))->_M_start,
                   (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start);
            *(undefined4 *)((long)local_b0->mNumUVComponents + lVar45) =
                 *(undefined4 *)((long)mesh->mNumUVComponents + lVar45);
          }
          ppaVar43 = ppaVar43 + 3;
          lVar45 = lVar45 + 4;
        } while (lVar45 != 0x20);
        paVar4 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar5 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar19 = local_b0;
        if (paVar4 != paVar5) {
          uVar36 = (long)paVar5 - (long)paVar4;
          uVar20 = 0xffffffffffffffff;
          if (-1 < (long)uVar36) {
            uVar20 = uVar36;
          }
          paVar25 = (aiColor4D *)operator_new__(uVar20);
          memset(paVar25,0,(uVar36 - 0x10 & 0xfffffffffffffff0) + 0x10);
          paVar19 = local_b0;
          local_b0->mColors[0] = paVar25;
          paVar4 = (mesh->mVertexColors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(paVar25,paVar4,
                 (long)(mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar4);
        }
        if (paVar19->mNumFaces != 0) {
          lVar45 = 0;
          lVar40 = 0;
          uVar20 = 0;
          do {
            *(undefined4 *)((long)&paVar19->mFaces->mNumIndices + lVar40) = 3;
            pvVar30 = operator_new__(0xc);
            *(void **)((long)&local_b0->mFaces->mIndices + lVar40) = pvVar30;
            **(undefined4 **)((long)&local_b0->mFaces->mIndices + lVar40) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45);
            *(undefined4 *)(*(long *)((long)&local_b0->mFaces->mIndices + lVar40) + 4) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45 + 4);
            *(undefined4 *)(*(long *)((long)&local_b0->mFaces->mIndices + lVar40) + 8) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45 + 8);
            uVar20 = uVar20 + 1;
            lVar40 = lVar40 + 0x10;
            lVar45 = lVar45 + 0x84;
            paVar19 = local_b0;
          } while (uVar20 < local_b0->mNumFaces);
        }
        pBVar32 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar37 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((pBVar32 != pBVar37) &&
           ((mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_80,(long)pBVar37 - (long)pBVar32 >> 5,(allocator_type *)&local_90);
          pBVar47 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar31 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pBVar47 != pBVar31) {
            uVar16 = 0;
            do {
              ppVar44 = (pBVar47->mBoneWeights).
                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (ppVar44 !=
                  (pBVar47->mBoneWeights).
                  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  local_90.second = ppVar44->second;
                  this_01 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                            ((_Vector_impl *)
                             &((local_80.
                                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                              _vptr_Material + ppVar44->first);
                  __position_00._M_current = *(aiVertexWeight **)(this_01 + 8);
                  local_90.first = uVar16;
                  if (__position_00._M_current == *(aiVertexWeight **)(this_01 + 0x10)) {
                    std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                    _M_realloc_insert<aiVertexWeight_const&>
                              (this_01,__position_00,(aiVertexWeight *)&local_90);
                  }
                  else {
                    aVar12.mWeight = local_90.second;
                    aVar12.mVertexId = uVar16;
                    *__position_00._M_current = aVar12;
                    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
                  }
                  ppVar44 = ppVar44 + 1;
                } while (ppVar44 !=
                         (pBVar47->mBoneWeights).
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
                pBVar31 = (mesh->mBoneVertices).
                          super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pBVar47 = pBVar47 + 1;
              uVar16 = uVar16 + 1;
            } while (pBVar47 != pBVar31);
          }
          paVar19 = local_b0;
          local_b0->mNumBones = 0;
          pBVar32 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar37 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = 0;
          if (pBVar37 != pBVar32) {
            uVar16 = 1;
            uVar36 = 0;
            do {
              if (((_Vector_impl *)
                  &((local_80.
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar36].super__Vector_impl_data._M_start !=
                  (pointer)(&((local_80.
                               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName.
                             _M_dataplus)[uVar36 * 3]._M_p) {
                uVar35 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar35;
                local_b0->mNumBones = uVar35;
                pBVar32 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pBVar37 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar36 = (ulong)uVar16;
              uVar16 = uVar16 + 1;
            } while (uVar36 < (ulong)((long)pBVar37 - (long)pBVar32 >> 5));
            uVar20 = uVar20 << 3;
          }
          ppaVar26 = (aiBone **)operator_new__(uVar20);
          paVar19->mBones = ppaVar26;
          pBVar32 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar37 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar37 != pBVar32) {
            uVar16 = 1;
            uVar20 = 0;
            pMVar18 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_a8 = (aiMesh *)(uVar20 * 3);
              if (((_Vector_impl *)&(pMVar18->super_Material)._vptr_Material)[uVar20].
                  super__Vector_impl_data._M_start !=
                  (pointer)(&(pMVar18->super_Material).mName._M_dataplus)[uVar20 * 3]._M_p) {
                local_a0 = (ulong *)CONCAT44(local_a0._4_4_,uVar16);
                local_98 = ppaVar26;
                paVar27 = (aiBone *)operator_new(0x450);
                (paVar27->mName).length = 0;
                (paVar27->mName).data[0] = '\0';
                memset((paVar27->mName).data + 1,0x1b,0x3ff);
                paVar27->mNumWeights = 0;
                paVar27->mWeights = (aiVertexWeight *)0x0;
                (paVar27->mOffsetMatrix).a1 = 1.0;
                (paVar27->mOffsetMatrix).a2 = 0.0;
                (paVar27->mOffsetMatrix).a3 = 0.0;
                (paVar27->mOffsetMatrix).a4 = 0.0;
                (paVar27->mOffsetMatrix).b1 = 0.0;
                (paVar27->mOffsetMatrix).b2 = 1.0;
                (paVar27->mOffsetMatrix).b3 = 0.0;
                (paVar27->mOffsetMatrix).b4 = 0.0;
                (paVar27->mOffsetMatrix).c1 = 0.0;
                (paVar27->mOffsetMatrix).c2 = 0.0;
                (paVar27->mOffsetMatrix).c3 = 1.0;
                (paVar27->mOffsetMatrix).c4 = 0.0;
                (paVar27->mOffsetMatrix).d1 = 0.0;
                (paVar27->mOffsetMatrix).d2 = 0.0;
                (paVar27->mOffsetMatrix).d3 = 0.0;
                (paVar27->mOffsetMatrix).d4 = 1.0;
                *local_98 = paVar27;
                pBVar32 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                uVar36 = pBVar32[uVar20].mName._M_string_length;
                if (uVar36 < 0x400) {
                  (paVar27->mName).length = (ai_uint32)uVar36;
                  memcpy((paVar27->mName).data,pBVar32[uVar20].mName._M_dataplus._M_p,uVar36);
                  (paVar27->mName).data[uVar36] = '\0';
                }
                local_60 = local_80.
                           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                uVar39 = (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName
                                 ._M_dataplus)[(long)local_a8]._M_p -
                         (long)(&(((_Vector_impl *)
                                  &((local_80.
                                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                                   _vptr_Material)->super__Vector_impl_data)._M_start)
                               [(long)local_a8];
                uVar36 = (long)uVar39 >> 3;
                paVar27->mNumWeights = (uint)uVar36;
                uVar36 = uVar36 & 0xffffffff;
                uVar20 = uVar36 * 8;
                local_88 = pBVar32;
                paVar28 = (aiVertexWeight *)operator_new__(uVar20);
                if (uVar36 != 0) {
                  memset(paVar28,0,uVar20);
                }
                pMVar18 = local_60;
                paVar27->mWeights = paVar28;
                memcpy(paVar28,(&(((_Vector_impl *)&(local_60->super_Material)._vptr_Material)->
                                 super__Vector_impl_data)._M_start)[(long)local_a8],
                       uVar39 & 0x7fffffff8);
                ppaVar26 = local_98 + 1;
                pBVar37 = (mesh->mBones).
                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                pBVar32 = local_88;
                uVar16 = (uint)local_a0;
              }
              uVar20 = (ulong)uVar16;
              uVar16 = uVar16 + 1;
            } while (uVar20 < (ulong)((long)pBVar37 - (long)pBVar32 >> 5));
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_80);
        }
      }
    }
  }
  else {
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              (&local_80,&pMVar18[uVar20].avSubMaterials);
    pMVar46 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pMVar18 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar20 = ((long)local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x2e0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar20;
    uVar36 = SUB168(auVar6 * ZEXT816(0x18),0);
    uVar39 = uVar36 + 8;
    if (0xfffffffffffffff7 < uVar36) {
      uVar39 = 0xffffffffffffffff;
    }
    if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
      uVar39 = 0xffffffffffffffff;
    }
    local_40 = (ulong *)operator_new__(uVar39);
    *local_40 = uVar20;
    local_68 = local_40 + 1;
    if (pMVar46 != pMVar18) {
      memset(local_68,0,((uVar36 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    local_b0 = (aiMesh *)((ulong)local_b0._4_4_ << 0x20);
    pFVar33 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
              super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar33) {
      uVar20 = 0;
      do {
        uVar36 = (ulong)pFVar33[uVar20].iMaterial;
        uVar39 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
        if (uVar39 < uVar36 || uVar39 - uVar36 == 0) {
          pLVar17 = DefaultLogger::get();
          Logger::warn(pLVar17,"Submaterial index is out of range");
          lVar45 = (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          __position_01._M_current = (uint *)local_68[lVar45 * -0x590b21642c8590b + -2];
          if (__position_01._M_current != (uint *)local_68[lVar45 * -0x590b21642c8590b + -1]) {
            puVar29 = local_68 + lVar45 * -0x590b21642c8590b + -2;
            *__position_01._M_current = (uint)local_b0;
            goto LAB_003deb82;
          }
          this_02 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    (local_68 + lVar45 * -0x590b21642c8590b + -3);
LAB_003deb95:
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_02,__position_01,(uint *)&local_b0);
        }
        else {
          __position_01._M_current = (uint *)local_68[uVar36 * 3 + 1];
          if (__position_01._M_current == (uint *)local_68[uVar36 * 3 + 2]) {
            this_02 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_68 + uVar36 * 3);
            goto LAB_003deb95;
          }
          puVar29 = local_68 + uVar36 * 3 + 1;
          *__position_01._M_current = (uint)uVar20;
LAB_003deb82:
          *puVar29 = *puVar29 + 4;
        }
        uVar20 = (ulong)((uint)local_b0 + 1);
        local_b0 = (aiMesh *)CONCAT44(local_b0._4_4_,(uint)local_b0 + 1);
        pFVar33 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar36 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar33 >> 2) *
                 0xf83e0f83e0f83e1;
        pMVar46 = local_80.
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pMVar18 = local_80.
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar20 <= uVar36 && uVar36 - uVar20 != 0);
    }
    if (pMVar46 != pMVar18) {
      local_60 = (pointer)mesh->amTexCoords;
      local_58 = 0;
      do {
        uVar20 = local_58;
        if (local_68[local_58 * 3] != local_68[local_58 * 3 + 1]) {
          paVar19 = (aiMesh *)operator_new(0x520);
          puVar29 = local_68;
          paVar19->mNumVertices = 0;
          paVar19->mNumFaces = 0;
          memset(&paVar19->mVertices,0,0xcc);
          paVar19->mBones = (aiBone **)0x0;
          paVar19->mMaterialIndex = 0;
          (paVar19->mName).length = 0;
          (paVar19->mName).data[0] = '\0';
          memset((paVar19->mName).data + 1,0x1b,0x3ff);
          paVar19->mNumAnimMeshes = 0;
          paVar19->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar19->mMethod = 0;
          (paVar19->mAABB).mMin.x = 0.0;
          (paVar19->mAABB).mMin.y = 0.0;
          (paVar19->mAABB).mMin.z = 0.0;
          (paVar19->mAABB).mMax.x = 0.0;
          (paVar19->mAABB).mMax.y = 0.0;
          (paVar19->mAABB).mMax.z = 0.0;
          memset(paVar19->mColors,0,0xa0);
          paVar19->mPrimitiveTypes = 4;
          paVar19->mMaterialIndex = (uint)local_58;
          *(undefined1 *)
           (*(long *)&(local_48->mParser->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start[mesh->iMaterialIndex].avSubMaterials
                      .
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl + 0x2d8 + uVar20 * 0x2e0) = 1;
          paVar19->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
          paVar19->mColors[2] = (aiColor4D *)mesh;
          iVar1._M_current = *(aiMesh ***)(local_50 + 8);
          local_b0 = paVar19;
          if (iVar1._M_current == *(aiMesh ***)(local_50 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_50,iVar1,(aiMesh **)&local_b0);
          }
          else {
            *iVar1._M_current = paVar19;
            *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
          }
          paVar19 = local_b0;
          puVar29 = puVar29 + uVar20 * 3;
          local_b0->mNumVertices = (int)(puVar29[1] - *puVar29 >> 2) * 3;
          uVar16 = (uint)(puVar29[1] - *puVar29 >> 2);
          local_b0->mNumFaces = uVar16;
          pBVar32 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar37 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar32 == pBVar37) {
            local_a8 = (aiMesh *)0x0;
          }
          else {
            uVar39 = (long)pBVar37 - (long)pBVar32 >> 5;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar39;
            uVar20 = SUB168(auVar7 * ZEXT816(0x18),0);
            uVar36 = uVar20 + 8;
            if (0xfffffffffffffff7 < uVar20) {
              uVar36 = 0xffffffffffffffff;
            }
            if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
              uVar36 = 0xffffffffffffffff;
            }
            puVar21 = (ulong *)operator_new__(uVar36);
            *puVar21 = uVar39;
            local_a8 = (aiMesh *)(puVar21 + 1);
            memset(local_a8,0,((uVar39 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            uVar16 = paVar19->mNumFaces;
          }
          uVar20 = (ulong)uVar16;
          puVar21 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
          *puVar21 = uVar20;
          paVar22 = (aiFace *)(puVar21 + 1);
          if (uVar20 != 0) {
            paVar34 = paVar22;
            do {
              paVar34->mNumIndices = 0;
              paVar34->mIndices = (uint *)0x0;
              paVar34 = paVar34 + 1;
            } while (paVar34 != paVar22 + uVar20);
          }
          paVar19->mFaces = paVar22;
          local_a0 = puVar29;
          if ((ulong)paVar19->mNumVertices != 0) {
            uVar20 = (ulong)paVar19->mNumVertices * 0xc;
            paVar23 = (aiVector3D *)operator_new__(uVar20);
            memset(paVar23,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
            paVar19->mVertices = paVar23;
            uVar16 = paVar19->mNumVertices;
            uVar20 = (ulong)uVar16 * 0xc;
            paVar23 = (aiVector3D *)operator_new__(uVar20);
            if (uVar16 != 0) {
              memset(paVar23,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar19->mNormals = paVar23;
            uVar20 = *local_a0;
            if (local_a0[1] != uVar20) {
              pBVar32 = (pointer)0x0;
              uVar36 = 0;
              do {
                uVar16 = *(uint *)(uVar20 + (long)pBVar32 * 4);
                local_88 = pBVar32;
                puVar24 = (uint *)operator_new__(0xc);
                local_98 = (aiBone **)((long)pBVar32 * 0x10);
                local_b0->mFaces[(long)pBVar32].mIndices = puVar24;
                local_b0->mFaces[(long)pBVar32].mNumIndices = 3;
                lVar45 = 0;
                do {
                  uVar20 = (ulong)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                  super_FaceWithSmoothingGroup.mIndices[lVar45];
                  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar23 = local_b0->mVertices;
                  uVar35 = (uint)uVar36;
                  paVar23[uVar36].z = *(float *)((long)(paVar2 + uVar20) + 8);
                  paVar2 = paVar2 + uVar20;
                  fVar13 = paVar2->y;
                  paVar23 = paVar23 + uVar36;
                  paVar23->x = paVar2->x;
                  paVar23->y = fVar13;
                  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar23 = local_b0->mNormals;
                  paVar23[uVar36].z = paVar2[uVar20].z;
                  paVar2 = paVar2 + uVar20;
                  fVar13 = paVar2->y;
                  paVar23 = paVar23 + uVar36;
                  paVar23->x = paVar2->x;
                  paVar23->y = fVar13;
                  if ((mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    if (local_a8 == (aiMesh *)0x0) {
                      __assert_fail("avOutputBones",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                                    ,0x400,
                                    "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                                   );
                    }
                    pBVar47 = (mesh->mBoneVertices).
                              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar36 = ((long)(mesh->mBoneVertices).
                                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar47 >> 3)
                             * -0x5555555555555555;
                    if ((uVar20 <= uVar36 && uVar36 - uVar20 != 0) &&
                       (ppVar44 = *(pointer *)
                                   &pBVar47[uVar20].mBoneWeights.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl,
                       ppVar44 !=
                       *(pointer *)
                        ((long)&pBVar47[uVar20].mBoneWeights.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl + 8))) {
                      do {
                        this_00 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                                   *)((long)local_a8 + (long)ppVar44->first * 3 * 8);
                        local_90.second = ppVar44->second;
                        __position._M_current = *(pair<unsigned_int,_float> **)(this_00 + 8);
                        local_90.first = uVar35;
                        if (__position._M_current == *(pair<unsigned_int,_float> **)(this_00 + 0x10)
                           ) {
                          std::
                          vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                          ::_M_realloc_insert<std::pair<unsigned_int,float>>
                                    (this_00,__position,&local_90);
                        }
                        else {
                          pVar11.second = local_90.second;
                          pVar11.first = uVar35;
                          *__position._M_current = pVar11;
                          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                        }
                        ppVar44 = ppVar44 + 1;
                      } while (ppVar44 !=
                               *(pointer *)
                                ((long)&(mesh->mBoneVertices).
                                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar20].
                                        mBoneWeights.
                                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                        ._M_impl + 8));
                    }
                  }
                  *(uint *)(*(long *)((long)&local_b0->mFaces->mIndices + (long)local_98) +
                           lVar45 * 4) = uVar35;
                  lVar45 = lVar45 + 1;
                  uVar36 = (ulong)(uVar35 + 1);
                } while (lVar45 != 3);
                pBVar32 = (pointer)(ulong)((int)local_88 + 1);
                uVar20 = *local_a0;
              } while (pBVar32 < (pointer)((long)(local_a0[1] - uVar20) >> 2));
            }
          }
          lVar45 = 0;
          pMVar18 = local_60;
          do {
            paVar19 = local_b0;
            if (((_Vector_impl *)&(pMVar18->super_Material)._vptr_Material)[lVar45].
                super__Vector_impl_data._M_start !=
                (pointer)(&(pMVar18->super_Material).mName._M_dataplus)[lVar45 * 3]._M_p) {
              uVar16 = local_b0->mNumVertices;
              uVar20 = (ulong)uVar16 * 0xc;
              local_98 = (aiBone **)(lVar45 * 3);
              paVar23 = (aiVector3D *)operator_new__(uVar20);
              if (uVar16 != 0) {
                memset(paVar23,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar19->mTextureCoords[lVar45] = paVar23;
              uVar20 = *local_a0;
              if (local_a0[1] != uVar20) {
                uVar36 = 0;
                iVar38 = 0;
                do {
                  uVar16 = *(uint *)(uVar20 + uVar36 * 4);
                  lVar40 = 0;
                  do {
                    uVar41 = iVar38 + (int)lVar40;
                    uVar35 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar16].
                             super_FaceWithSmoothingGroup.mIndices[lVar40];
                    paVar2 = (&(((_Vector_impl *)&(local_60->super_Material)._vptr_Material)->
                               super__Vector_impl_data)._M_start)[(long)local_98];
                    paVar23 = local_b0->mTextureCoords[lVar45];
                    paVar23[uVar41].z = paVar2[uVar35].z;
                    paVar2 = paVar2 + uVar35;
                    fVar13 = paVar2->y;
                    paVar23 = paVar23 + uVar41;
                    paVar23->x = paVar2->x;
                    paVar23->y = fVar13;
                    lVar40 = lVar40 + 1;
                  } while (lVar40 != 3);
                  uVar36 = (ulong)((int)uVar36 + 1);
                  uVar20 = *local_a0;
                  iVar38 = iVar38 + 3;
                } while (uVar36 < (ulong)((long)(local_a0[1] - uVar20) >> 2));
              }
              local_b0->mNumUVComponents[lVar45] = mesh->mNumUVComponents[lVar45];
              pMVar18 = local_60;
            }
            paVar19 = local_b0;
            lVar45 = lVar45 + 1;
          } while (lVar45 != 8);
          if ((mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar16 = local_b0->mNumVertices;
            uVar20 = (ulong)uVar16 << 4;
            paVar25 = (aiColor4D *)operator_new__(uVar20);
            if (uVar16 != 0) {
              memset(paVar25,0,uVar20);
            }
            paVar19->mColors[0] = paVar25;
            uVar20 = *local_a0;
            if (local_a0[1] != uVar20) {
              uVar36 = 0;
              iVar38 = 0;
              do {
                uVar16 = *(uint *)(uVar20 + uVar36 * 4);
                lVar45 = 0;
                do {
                  paVar4 = (mesh->mVertexColors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super_FaceWithSmoothingGroup.mIndices[lVar45];
                  fVar13 = paVar4->g;
                  fVar14 = paVar4->b;
                  fVar15 = paVar4->a;
                  paVar25 = paVar19->mColors[0] + (uint)(iVar38 + (int)lVar45);
                  paVar25->r = paVar4->r;
                  paVar25->g = fVar13;
                  paVar25->b = fVar14;
                  paVar25->a = fVar15;
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 3);
                uVar36 = (ulong)((int)uVar36 + 1);
                uVar20 = *local_a0;
                iVar38 = iVar38 + 3;
              } while (uVar36 < (ulong)((long)(local_a0[1] - uVar20) >> 2));
            }
          }
          paVar19 = local_b0;
          pMVar46 = local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pMVar18 = local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_b0->mNumBones = 0;
            pBVar32 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar37 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (pBVar37 == pBVar32) {
              uVar20 = 0;
            }
            else {
              uVar16 = 0;
              uVar35 = 1;
              uVar20 = 0;
              do {
                if (*(ulong *)((long)local_a8 + uVar20 * 3 * 8) !=
                    *(ulong *)((long)local_a8 + (uVar20 * 3 + 1) * 8)) {
                  uVar16 = uVar16 + 1;
                  local_b0->mNumBones = uVar16;
                  pBVar32 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pBVar37 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar20 = (ulong)uVar35;
                uVar35 = uVar35 + 1;
              } while (uVar20 < (ulong)((long)pBVar37 - (long)pBVar32 >> 5));
              uVar20 = (ulong)uVar16 << 3;
            }
            ppaVar26 = (aiBone **)operator_new__(uVar20);
            paVar19->mBones = ppaVar26;
            pBVar32 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pBVar37 = (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (pBVar37 == pBVar32) {
              pMVar46 = local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pMVar18 = local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_a8 == (aiMesh *)0x0) goto LAB_003df50e;
            }
            else {
              puVar29 = (ulong *)0x0;
              do {
                if (*(ulong *)((long)local_a8 + (long)puVar29 * 3 * 8) !=
                    *(ulong *)((long)local_a8 + ((long)puVar29 * 3 + 1) * 8)) {
                  local_a0 = puVar29;
                  local_98 = ppaVar26;
                  paVar27 = (aiBone *)operator_new(0x450);
                  (paVar27->mName).length = 0;
                  (paVar27->mName).data[0] = '\0';
                  memset((paVar27->mName).data + 1,0x1b,0x3ff);
                  paVar27->mNumWeights = 0;
                  paVar27->mWeights = (aiVertexWeight *)0x0;
                  (paVar27->mOffsetMatrix).a1 = 1.0;
                  (paVar27->mOffsetMatrix).a2 = 0.0;
                  (paVar27->mOffsetMatrix).a3 = 0.0;
                  (paVar27->mOffsetMatrix).a4 = 0.0;
                  (paVar27->mOffsetMatrix).b1 = 0.0;
                  (paVar27->mOffsetMatrix).b2 = 1.0;
                  (paVar27->mOffsetMatrix).b3 = 0.0;
                  (paVar27->mOffsetMatrix).b4 = 0.0;
                  (paVar27->mOffsetMatrix).c1 = 0.0;
                  (paVar27->mOffsetMatrix).c2 = 0.0;
                  (paVar27->mOffsetMatrix).c3 = 1.0;
                  (paVar27->mOffsetMatrix).c4 = 0.0;
                  (paVar27->mOffsetMatrix).d1 = 0.0;
                  (paVar27->mOffsetMatrix).d2 = 0.0;
                  (paVar27->mOffsetMatrix).d3 = 0.0;
                  (paVar27->mOffsetMatrix).d4 = 1.0;
                  *local_98 = paVar27;
                  pBVar32 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar20 = pBVar32[(long)puVar29].mName._M_string_length;
                  if (uVar20 < 0x400) {
                    (paVar27->mName).length = (ai_uint32)uVar20;
                    memcpy((paVar27->mName).data,pBVar32[(long)puVar29].mName._M_dataplus._M_p,
                           uVar20);
                    (paVar27->mName).data[uVar20] = '\0';
                  }
                  puVar29 = (ulong *)((long)local_a8 + (long)puVar29 * 3 * 8);
                  uVar20 = (long)(puVar29[1] - *puVar29) >> 3;
                  uVar16 = (uint)uVar20;
                  paVar27->mNumWeights = uVar16;
                  uVar20 = uVar20 & 0xffffffff;
                  local_38 = uVar20 * 8;
                  local_88 = pBVar32;
                  paVar28 = (aiVertexWeight *)operator_new__(local_38);
                  if (uVar20 != 0) {
                    memset(paVar28,0,local_38);
                  }
                  paVar27->mWeights = paVar28;
                  pBVar32 = local_88;
                  if (uVar16 != 0) {
                    uVar20 = 0;
                    do {
                      uVar36 = *puVar29;
                      paVar27->mWeights[uVar20].mVertexId = *(uint *)(uVar36 + uVar20 * 8);
                      paVar27->mWeights[uVar20].mWeight = *(float *)(uVar36 + 4 + uVar20 * 8);
                      uVar20 = uVar20 + 1;
                    } while (uVar20 < paVar27->mNumWeights);
                    pBVar32 = (mesh->mBones).
                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  ppaVar26 = local_98 + 1;
                  pBVar37 = (mesh->mBones).
                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  puVar29 = local_a0;
                }
                puVar29 = (ulong *)(ulong)((int)puVar29 + 1);
              } while (puVar29 < (ulong *)((long)pBVar37 - (long)pBVar32 >> 5));
            }
            if (*(ulong *)((long)local_a8 + -8) != 0) {
              lVar45 = *(ulong *)((long)local_a8 + -8) * 0x18;
              do {
                pvVar30 = *(void **)((long)local_a8 + lVar45 + -0x18);
                if (pvVar30 != (void *)0x0) {
                  operator_delete(pvVar30);
                }
                lVar45 = lVar45 + -0x18;
              } while (lVar45 != 0);
            }
            operator_delete__((ulong *)((long)local_a8 + -8));
            pMVar46 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pMVar18 = local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
LAB_003df50e:
        local_58 = (ulong)((int)local_58 + 1);
        uVar20 = ((long)pMVar46 - (long)pMVar18 >> 5) * -0x2c8590b21642c859;
      } while (local_58 <= uVar20 && uVar20 - local_58 != 0);
    }
    puVar29 = local_40;
    if (*local_40 != 0) {
      lVar45 = *local_40 * 0x18;
      do {
        pvVar30 = *(void **)((long)puVar29 + lVar45 + -0x10);
        if (pvVar30 != (void *)0x0) {
          operator_delete(pvVar30);
        }
        lVar45 = lVar45 + -0x18;
      } while (lVar45 != 0);
    }
    operator_delete__(puVar29);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_80);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}